

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall wallet::LegacyScriptPubKeyMan::SetHDSeed(LegacyScriptPubKeyMan *this,CPubKey *seed)

{
  long lVar1;
  WalletStorage *pWVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock40;
  undefined1 local_68 [16];
  uchar local_58 [8];
  CHDChain newHdChain;
  long *plVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock40,
             &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x4df,false);
  CHDChain::CHDChain(&newHdChain);
  pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  uVar3 = (*pWVar2->_vptr_WalletStorage[6])(pWVar2,0x2227c);
  newHdChain.nVersion = (uVar3 & 0xff) + 1;
  CPubKey::GetID((CKeyID *)local_68,seed);
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10] = local_58[0];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11] = local_58[1];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12] = local_58[2];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13] = local_58[3];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = local_68[0];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = local_68[1];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = local_68[2];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = local_68[3];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[4] = local_68[4];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[5] = local_68[5];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[6] = local_68[6];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[7] = local_68[7];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[8] = local_68[8];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[9] = local_68[9];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[10] = local_68[10];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb] = local_68[0xb];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc] = local_68[0xc];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd] = local_68[0xd];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe] = local_68[0xe];
  newHdChain.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf] = local_68[0xf];
  AddHDChain(this,&newHdChain);
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyCanGetAddressesChanged);
  iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  plVar5 = (long *)CONCAT44(extraout_var,iVar4);
  (**(code **)(*plVar5 + 0x70))(local_68,plVar5,1);
  local_68._8_8_ = plVar5;
  (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[5])();
  if ((long *)local_68._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_68._0_8_ + 0x28))();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock40.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::SetHDSeed(const CPubKey& seed)
{
    LOCK(cs_KeyStore);
    // store the keyid (hash160) together with
    // the child index counter in the database
    // as a hdchain object
    CHDChain newHdChain;
    newHdChain.nVersion = m_storage.CanSupportFeature(FEATURE_HD_SPLIT) ? CHDChain::VERSION_HD_CHAIN_SPLIT : CHDChain::VERSION_HD_BASE;
    newHdChain.seed_id = seed.GetID();
    AddHDChain(newHdChain);
    NotifyCanGetAddressesChanged();
    WalletBatch batch(m_storage.GetDatabase());
    m_storage.UnsetBlankWalletFlag(batch);
}